

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULibCal.cpp
# Opt level: O2

void newIMU(void)

{
  int iVar1;
  
  if (imu != (RTIMU *)0x0) {
    (**(code **)(*(long *)imu + 8))();
  }
  imu = (RTIMU *)RTIMU::createIMU(settings);
  if (imu != (RTIMU *)0x0) {
    iVar1 = (**(code **)(*(long *)imu + 0x18))(imu);
    if (iVar1 != 1) {
      (**(code **)(*(long *)imu + 0x20))();
      return;
    }
  }
  puts("No IMU found");
  exit(1);
}

Assistant:

void newIMU()
{
    if (imu != NULL)
        delete imu;

    imu = RTIMU::createIMU(settings);

    if ((imu == NULL) || (imu->IMUType() == RTIMU_TYPE_NULL)) {
        printf("No IMU found\n");
        exit(1);
    }

    //  set up IMU

    imu->IMUInit();
}